

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O0

void __thiscall
Assimp::ComputeUVMappingProcess::Execute(ComputeUVMappingProcess *this,aiScene *pScene)

{
  uint uVar1;
  aiMaterial *this_00;
  aiMaterialProperty *paVar2;
  aiMaterialProperty *paVar3;
  aiMesh *mesh_00;
  float fVar4;
  bool bVar5;
  int iVar6;
  float fVar7;
  Logger *pLVar8;
  DeadlyImportError *this_01;
  char *pcVar9;
  char *pcVar10;
  reference pMVar11;
  ulong uVar12;
  aiVector3D *out;
  aiVector3t<float> *local_570;
  aiVector3D *p;
  uint outIdx;
  aiMesh *mesh;
  iterator iStack_4d8;
  uint m;
  _List_node_base *local_4d0;
  _List_iterator<Assimp::ComputeUVMappingProcess::MappingInfo> local_4c8;
  _Self local_4c0;
  iterator it;
  uint idx;
  aiMaterialProperty *prop2;
  uint a2;
  MappingInfo info;
  aiTextureMapping *mapping;
  aiMaterialProperty *prop;
  uint a;
  aiMaterial *mat;
  undefined1 local_468 [4];
  uint i;
  list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
  mappingStack;
  allocator local_439;
  string local_438;
  char local_418 [8];
  char buffer [1024];
  aiScene *pScene_local;
  ComputeUVMappingProcess *this_local;
  
  buffer._1016_8_ = pScene;
  pLVar8 = DefaultLogger::get();
  Logger::debug(pLVar8,"GenUVCoordsProcess begin");
  if ((*(uint *)buffer._1016_8_ & 8) != 0) {
    mappingStack.
    super__List_base<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
    ._M_impl._M_node._M_size._3_1_ = 1;
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_438,
               "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here"
               ,&local_439);
    DeadlyImportError::DeadlyImportError(this_01,&local_438);
    mappingStack.
    super__List_base<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
    ._M_impl._M_node._M_size._3_1_ = 0;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::__cxx11::
  list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
  ::list((list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
          *)local_468);
  mat._4_4_ = 0;
  do {
    if (*(uint *)(buffer._1016_8_ + 0x20) <= mat._4_4_) {
      pLVar8 = DefaultLogger::get();
      Logger::debug(pLVar8,"GenUVCoordsProcess finished");
      std::__cxx11::
      list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
      ::~list((list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
               *)local_468);
      return;
    }
    std::__cxx11::
    list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
    ::clear((list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
             *)local_468);
    this_00 = *(aiMaterial **)(*(long *)(buffer._1016_8_ + 0x28) + (ulong)mat._4_4_ * 8);
    for (prop._4_4_ = 0; prop._4_4_ < this_00->mNumProperties; prop._4_4_ = prop._4_4_ + 1) {
      paVar2 = this_00->mProperties[prop._4_4_];
      iVar6 = strcmp((paVar2->mKey).data,"$tex.mapping");
      if ((iVar6 == 0) && (info._12_8_ = paVar2->mData, *(int *)info._12_8_ != 0)) {
        bVar5 = DefaultLogger::isNullLogger();
        if (!bVar5) {
          pcVar9 = TextureTypeToString(paVar2->mSemantic);
          uVar1 = paVar2->mIndex;
          pcVar10 = MappingTypeToString(*(aiTextureMapping *)info._12_8_);
          snprintf(local_418,0x400,"Found non-UV mapped texture (%s,%u). Mapping type: %s",pcVar9,
                   (ulong)uVar1,pcVar10);
          pLVar8 = DefaultLogger::get();
          Logger::info(pLVar8,local_418);
        }
        if (*(int *)info._12_8_ != 5) {
          MappingInfo::MappingInfo
                    ((MappingInfo *)((long)&prop2 + 4),*(aiTextureMapping *)info._12_8_);
          for (prop2._0_4_ = 0; (uint)prop2 < this_00->mNumProperties; prop2._0_4_ = (uint)prop2 + 1
              ) {
            paVar3 = this_00->mProperties[(uint)prop2];
            if (((paVar3->mSemantic == paVar2->mSemantic) && (paVar3->mIndex == paVar2->mIndex)) &&
               (iVar6 = strcmp((paVar3->mKey).data,"$tex.mapaxis"), iVar6 == 0)) {
              _a2 = *(undefined8 *)paVar3->mData;
              info.axis.x = *(float *)(paVar3->mData + 8);
              break;
            }
          }
          it._M_node._4_4_ = 2.312234e-35;
          local_4c8._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
               ::begin((list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
                        *)local_468);
          local_4d0 = (_List_node_base *)
                      std::__cxx11::
                      list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
                      ::end((list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
                             *)local_468);
          local_4c0._M_node =
               (_List_node_base *)
               std::
               find<std::_List_iterator<Assimp::ComputeUVMappingProcess::MappingInfo>,Assimp::ComputeUVMappingProcess::MappingInfo>
                         (local_4c8,
                          (_List_iterator<Assimp::ComputeUVMappingProcess::MappingInfo>)local_4d0,
                          (MappingInfo *)((long)&prop2 + 4));
          iStack_4d8 = std::__cxx11::
                       list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
                       ::end((list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
                              *)local_468);
          bVar5 = std::operator!=(&stack0xfffffffffffffb28,&local_4c0);
          if (bVar5) {
            pMVar11 = std::_List_iterator<Assimp::ComputeUVMappingProcess::MappingInfo>::operator*
                                (&local_4c0);
            it._M_node._4_4_ = (float)pMVar11->uv;
          }
          else {
            for (mesh._4_4_ = 0; mesh._4_4_ < *(uint *)(buffer._1016_8_ + 0x10);
                mesh._4_4_ = mesh._4_4_ + 1) {
              mesh_00 = *(aiMesh **)(*(long *)(buffer._1016_8_ + 0x18) + (ulong)mesh._4_4_ * 8);
              fVar4 = it._M_node._4_4_;
              if (((mesh_00->mMaterialIndex == mat._4_4_) &&
                  (fVar7 = (float)FindEmptyUVChannel(mesh_00), fVar4 = it._M_node._4_4_,
                  fVar7 != -NAN)) && (mesh_00->mNumVertices != 0)) {
                uVar12 = (ulong)mesh_00->mNumVertices;
                out = (aiVector3D *)operator_new__(uVar12 * 0xc);
                if (uVar12 != 0) {
                  local_570 = out;
                  do {
                    aiVector3t<float>::aiVector3t(local_570);
                    local_570 = local_570 + 1;
                  } while (local_570 != out + uVar12);
                }
                mesh_00->mTextureCoords[(uint)fVar7] = out;
                switch(*(undefined4 *)info._12_8_) {
                case 1:
                  ComputeSphereMapping(this,mesh_00,(aiVector3D *)&a2,out);
                  break;
                case 2:
                  ComputeCylinderMapping(this,mesh_00,(aiVector3D *)&a2,out);
                  break;
                case 3:
                  ComputeBoxMapping(this,mesh_00,out);
                  break;
                case 4:
                  ComputePlaneMapping(this,mesh_00,(aiVector3D *)&a2,out);
                  break;
                default:
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ComputeUVMappingProcess.cpp"
                                ,0x1e4,
                                "virtual void Assimp::ComputeUVMappingProcess::Execute(aiScene *)");
                }
                fVar4 = fVar7;
                if ((mesh._4_4_ != 0) && (it._M_node._4_4_ != fVar7)) {
                  pLVar8 = DefaultLogger::get();
                  Logger::warn(pLVar8,
                               "UV index mismatch. Not all meshes assigned to this material have equal numbers of UV channels. The UV index stored in  the material structure does therefore not apply for all meshes. "
                              );
                }
              }
              it._M_node._4_4_ = fVar4;
            }
            info.axis.y = it._M_node._4_4_;
            std::__cxx11::
            list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
            ::push_back((list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
                         *)local_468,(value_type *)((long)&prop2 + 4));
          }
          *(undefined4 *)info._12_8_ = 0;
          aiMaterial::AddProperty<unsigned_int>
                    (this_00,(uint *)((long)&it._M_node + 4),1,"$tex.uvwsrc",paVar2->mSemantic,
                     paVar2->mIndex);
        }
      }
    }
    mat._4_4_ = mat._4_4_ + 1;
  } while( true );
}

Assistant:

void ComputeUVMappingProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("GenUVCoordsProcess begin");
    char buffer[1024];

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT)
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");

    std::list<MappingInfo> mappingStack;

    /*  Iterate through all materials and search for non-UV mapped textures
     */
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
    {
        mappingStack.clear();
        aiMaterial* mat = pScene->mMaterials[i];
        for (unsigned int a = 0; a < mat->mNumProperties;++a)
        {
            aiMaterialProperty* prop = mat->mProperties[a];
            if (!::strcmp( prop->mKey.data, "$tex.mapping"))
            {
                aiTextureMapping& mapping = *((aiTextureMapping*)prop->mData);
                if (aiTextureMapping_UV != mapping)
                {
                    if (!DefaultLogger::isNullLogger())
                    {
                        ai_snprintf(buffer, 1024, "Found non-UV mapped texture (%s,%u). Mapping type: %s",
                            TextureTypeToString((aiTextureType)prop->mSemantic),prop->mIndex,
                            MappingTypeToString(mapping));

                        ASSIMP_LOG_INFO(buffer);
                    }

                    if (aiTextureMapping_OTHER == mapping)
                        continue;

                    MappingInfo info (mapping);

                    // Get further properties - currently only the major axis
                    for (unsigned int a2 = 0; a2 < mat->mNumProperties;++a2)
                    {
                        aiMaterialProperty* prop2 = mat->mProperties[a2];
                        if (prop2->mSemantic != prop->mSemantic || prop2->mIndex != prop->mIndex)
                            continue;

                        if ( !::strcmp( prop2->mKey.data, "$tex.mapaxis"))  {
                            info.axis = *((aiVector3D*)prop2->mData);
                            break;
                        }
                    }

                    unsigned int idx( 99999999 );

                    // Check whether we have this mapping mode already
                    std::list<MappingInfo>::iterator it = std::find (mappingStack.begin(),mappingStack.end(), info);
                    if (mappingStack.end() != it)
                    {
                        idx = (*it).uv;
                    }
                    else
                    {
                        /*  We have found a non-UV mapped texture. Now
                        *   we need to find all meshes using this material
                        *   that we can compute UV channels for them.
                        */
                        for (unsigned int m = 0; m < pScene->mNumMeshes;++m)
                        {
                            aiMesh* mesh = pScene->mMeshes[m];
                            unsigned int outIdx = 0;
                            if ( mesh->mMaterialIndex != i || ( outIdx = FindEmptyUVChannel(mesh) ) == UINT_MAX ||
                                !mesh->mNumVertices)
                            {
                                continue;
                            }

                            // Allocate output storage
                            aiVector3D* p = mesh->mTextureCoords[outIdx] = new aiVector3D[mesh->mNumVertices];

                            switch (mapping)
                            {
                            case aiTextureMapping_SPHERE:
                                ComputeSphereMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_CYLINDER:
                                ComputeCylinderMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_PLANE:
                                ComputePlaneMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_BOX:
                                ComputeBoxMapping(mesh,p);
                                break;
                            default:
                                ai_assert(false);
                            }
                            if (m && idx != outIdx)
                            {
                                ASSIMP_LOG_WARN("UV index mismatch. Not all meshes assigned to "
                                    "this material have equal numbers of UV channels. The UV index stored in  "
                                    "the material structure does therefore not apply for all meshes. ");
                            }
                            idx = outIdx;
                        }
                        info.uv = idx;
                        mappingStack.push_back(info);
                    }

                    // Update the material property list
                    mapping = aiTextureMapping_UV;
                    ((aiMaterial*)mat)->AddProperty(&idx,1,AI_MATKEY_UVWSRC(prop->mSemantic,prop->mIndex));
                }
            }
        }
    }
    ASSIMP_LOG_DEBUG("GenUVCoordsProcess finished");
}